

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

uint64_t helper_sub64_ssov(CPUTriCoreState *env,uint64_t r1,uint64_t r2)

{
  uint64_t uVar1;
  uint uVar2;
  
  uVar1 = r1 - r2;
  uVar2 = (uint)(uVar1 * 2 >> 0x20) ^ (uint)(uVar1 >> 0x20);
  env->PSW_USB_AV = uVar2;
  env->PSW_USB_SAV = env->PSW_USB_SAV | uVar2;
  if (-1 < (long)((uVar1 ^ r1) & (r2 ^ r1))) {
    env->PSW_USB_V = 0;
    return uVar1;
  }
  env->PSW_USB_V = 0x80000000;
  env->PSW_USB_SV = 0x80000000;
  uVar1 = 0x8000000000000000;
  if (-1 < (long)r1) {
    uVar1 = 0x7fffffffffffffff;
  }
  return uVar1;
}

Assistant:

uint64_t helper_sub64_ssov(CPUTriCoreState *env, uint64_t r1, uint64_t r2)
{
    uint64_t result;
    int64_t ovf;

    result = r1 - r2;
    ovf = (result ^ r1) & (r1 ^ r2);
    env->PSW_USB_AV = (result ^ result * 2u) >> 32;
    env->PSW_USB_SAV |= env->PSW_USB_AV;
    if (ovf < 0) {
        env->PSW_USB_V = (1 << 31);
        env->PSW_USB_SV = (1 << 31);
        /* ext_ret > MAX_INT */
        if ((int64_t)r1 >= 0) {
            result = INT64_MAX;
        /* ext_ret < MIN_INT */
        } else {
            result = INT64_MIN;
        }
    } else {
        env->PSW_USB_V = 0;
    }
    return result;
}